

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
resolveExternals(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t *puVar1;
  
  do {
    puVar1 = *(uint8_t **)this;
    this = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)(puVar1 + 1);
  } while (*puVar1 == '\x1d');
  return (Slice)puVar1;
}

Assistant:

SliceType resolveExternals() const {
    uint8_t const* current = start();
    while (*current == 0x1d) {
      current =
          reinterpret_cast<uint8_t const*>(SliceType(current).extractPointer());
    }
    return SliceType(current);
  }